

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory_tests.cc
# Opt level: O0

void __thiscall
lf::mesh::hybrid2d::test::lf_hybrid2d_EdgeNumbering_Test::~lf_hybrid2d_EdgeNumbering_Test
          (lf_hybrid2d_EdgeNumbering_Test *this)

{
  lf_hybrid2d_EdgeNumbering_Test *this_local;
  
  ~lf_hybrid2d_EdgeNumbering_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lf_hybrid2d, EdgeNumbering) {
  // Construct a one element mesh that consists of a quad:
  MeshFactory mf(2);

  // add nodes
  EXPECT_EQ(mf.AddPoint(Eigen::Vector2d(0, 0)), 0);
  EXPECT_EQ(mf.AddPoint(Eigen::Vector2d(1, 0)), 1);
  EXPECT_EQ(mf.AddPoint(Eigen::Vector2d(1, 1)), 2);
  EXPECT_EQ(mf.AddPoint(Eigen::Vector2d(0, 1)), 3);

  // add an element
  Eigen::MatrixXd node_coord(2, 4);
  node_coord << 0, 1, 1, 0, 0, 0, 1, 1;
  EXPECT_EQ(0, mf.AddEntity(
                   base::RefEl::kQuad(), std::array<size_type, 4>{{0, 1, 2, 3}},
                   std::make_unique<geometry::QuadO1>(std::move(node_coord))));

  // explicitly add the right edge:
  node_coord = Eigen::MatrixXd(2, 2);
  node_coord << 1, 1, 0, 1;
  EXPECT_EQ(
      0, mf.AddEntity(base::RefEl::kSegment(), std::array<size_type, 2>{{1, 2}},
                      std::make_unique<geometry::SegmentO1>(node_coord)));

  // build the mesh
  auto mesh = mf.Build();

  EXPECT_EQ(mesh->NumEntities(0), 1);
  EXPECT_EQ(mesh->NumEntities(1), 4);
  EXPECT_EQ(mesh->NumEntities(2), 4);

  // check indices of the nodes:
  Eigen::VectorXd zero = Eigen::VectorXd::Zero(0);
  auto entities2 = mesh->Entities(2);
  auto node0 = std::find_if(entities2.begin(), entities2.end(), [&](auto e) {
    return e->Geometry()->Global(zero).norm() < 1e-6;
  });
  EXPECT_NE(node0, entities2.end());
  EXPECT_EQ(mesh->Index(**node0), 0);

  auto node1 = std::find_if(entities2.begin(), entities2.end(), [&](auto& e) {
    return e->Geometry()->Global(zero).isApprox(Eigen::Vector2d(1, 0));
  });
  EXPECT_NE(node1, entities2.end());
  EXPECT_EQ(mesh->Index(**node1), 1);

  auto node2 = std::find_if(entities2.begin(), entities2.end(), [&](auto& e) {
    return e->Geometry()->Global(zero).isApprox(Eigen::Vector2d(1, 1));
  });
  EXPECT_NE(node2, entities2.end());
  EXPECT_EQ(mesh->Index(**node2), 2);

  auto node3 = std::find_if(entities2.begin(), entities2.end(), [&](auto& e) {
    return e->Geometry()->Global(zero).isApprox(Eigen::Vector2d(0, 1));
  });
  EXPECT_NE(node3, entities2.end());
  EXPECT_EQ(mesh->Index(**node3), 3);

  // check index of right edge:
  auto entities1 = mesh->Entities(1);
  auto right_edge =
      std::find_if(entities1.begin(), entities1.end(), [](auto& e) {
        return e->Geometry()
            ->Global(Eigen::VectorXd::Constant(1, 0.5))
            .isApprox(Eigen::Vector2d(1, 0.5));
      });
  EXPECT_NE(right_edge, entities1.end());
  EXPECT_EQ(mesh->Index(**right_edge), 0);

  // check index of element:
  EXPECT_EQ(mesh->Index(**mesh->Entities(0).begin()), 0);
}